

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O0

uint * RDL_getEdgesURF(RDL_data *data,uint index)

{
  uint bcc_index_00;
  uint urf_internal_index;
  uint uVar1;
  RDL_graph *pRVar2;
  char *edges_00;
  uint *puVar3;
  RDL_graph *graph;
  uint *result;
  char *edges;
  uint internal_index;
  uint bcc_index;
  uint alloced;
  uint nextfree;
  uint nofFams;
  uint i;
  uint index_local;
  RDL_data *data_local;
  
  bcc_index = 0;
  bcc_index_00 = data->urf_to_bcc[index][0];
  urf_internal_index = data->urf_to_bcc[index][1];
  pRVar2 = data->bccGraphs->bcc_graphs[bcc_index_00];
  edges_00 = (char *)malloc((ulong)pRVar2->E);
  memset(edges_00,0,(ulong)pRVar2->E);
  uVar1 = data->urfInfoPerBCC[bcc_index_00]->nofCFsPerURF[urf_internal_index];
  internal_index = 0x40;
  graph = (RDL_graph *)malloc(0x100);
  for (nextfree = 0; nextfree < uVar1; nextfree = nextfree + 1) {
    RDL_getEdges_internal(data,bcc_index_00,urf_internal_index,nextfree,edges_00);
  }
  for (nextfree = 0; nextfree < pRVar2->E; nextfree = nextfree + 1) {
    if (edges_00[nextfree] == '\x01') {
      if (bcc_index == internal_index) {
        internal_index = internal_index << 1;
        graph = (RDL_graph *)realloc(graph,(ulong)internal_index << 2);
      }
      (&graph->V)[bcc_index] = data->bccGraphs->edge_from_bcc_mapping[bcc_index_00][nextfree];
      bcc_index = bcc_index + 1;
    }
  }
  puVar3 = (uint *)realloc(graph,(ulong)(bcc_index + 1) << 2);
  puVar3[bcc_index] = 0xffffffff;
  free(edges_00);
  return puVar3;
}

Assistant:

static unsigned *RDL_getEdgesURF(const RDL_data *data, unsigned index)
{
  unsigned i,nofFams,nextfree=0,alloced, bcc_index, internal_index;
  char *edges;
  unsigned *result;
  const RDL_graph* graph;

  /* map indices */
  bcc_index = data->urf_to_bcc[index][0];
  internal_index = data->urf_to_bcc[index][1];
  graph = data->bccGraphs->bcc_graphs[bcc_index];
  edges = malloc(graph->E * sizeof(*edges));
  memset(edges, 0, graph->E * sizeof(*edges));

  nofFams = data->urfInfoPerBCC[bcc_index]->nofCFsPerURF[internal_index];
  alloced = RDL_RESERVED_START;
  result = malloc(alloced * sizeof(*result));

  /* iterate over all RCFs in this URF and collect results in bitset (edges) */
  for(i=0; i<nofFams; ++i) {
    RDL_getEdges_internal(data, bcc_index, internal_index, i, edges);
  }

  /* translate into dynamic table */
  for(i=0; i<graph->E; ++i) {
    if(edges[i] == 1) {
      if(nextfree == alloced)
      {/*double the size*/
        alloced *= 2;
        result = realloc(result, alloced*sizeof(*result));
      }
      result[nextfree++] = data->bccGraphs->edge_from_bcc_mapping[bcc_index][i];
    }
  }
  result = realloc(result, (nextfree+1)*sizeof(*result));

  result[nextfree] = UINT_MAX;

  free(edges);
  return result;
}